

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

int fy_node_mapping_sort_cmp_default(fy_node_pair *fynp_a,fy_node_pair *fynp_b,void *arg)

{
  fy_node *fyn;
  fy_node *fyn_00;
  _Bool _Var1;
  _Bool _Var2;
  byte bVar3;
  int iVar4;
  int iVar5;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  
  if (arg == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = fy_node_scalar_cmp_default;
    uVar6 = 0;
  }
  else {
    UNRECOVERED_JUMPTABLE = *arg;
    uVar6 = *(undefined8 *)((long)arg + 8);
  }
  fyn = fynp_a->key;
  bVar8 = true;
  bVar7 = true;
  if (fyn != (fy_node *)0x0) {
    bVar7 = (fyn->field_0x34 & 3) == 0;
  }
  fyn_00 = fynp_b->key;
  if (fyn_00 != (fy_node *)0x0) {
    bVar8 = (fyn_00->field_0x34 & 3) == 0;
  }
  if (((bool)(bVar7 ^ 1U)) || ((bool)(bVar8 ^ 1U))) {
    if ((bool)(bVar7 | bVar8 ^ 1U)) {
      if (!(bool)(bVar7 ^ 1U) && !bVar8) {
        return 1;
      }
      bVar3 = fyn->field_0x34 & 3;
      if (bVar3 == (fyn_00->field_0x34 & 3)) {
        iVar4 = fy_node_mapping_get_pair_index(fynp_a->parent,fynp_a);
        iVar5 = fy_node_mapping_get_pair_index(fynp_b->parent,fynp_b);
        if (iVar4 <= iVar5) {
          return -(uint)(iVar4 < iVar5);
        }
        return 1;
      }
      return (uint)(bVar3 != 2) * 2 + -1;
    }
  }
  else {
    _Var1 = fy_node_is_alias(fyn);
    _Var2 = fy_node_is_alias(fyn_00);
    if ((~_Var1 & 1U) != 0 || _Var2) {
      if (!_Var1 && (~_Var2 & 1U) == 0) {
        return 1;
      }
      iVar4 = (*UNRECOVERED_JUMPTABLE)(fyn,fyn_00,uVar6);
      return iVar4;
    }
  }
  return -1;
}

Assistant:

static int fy_node_mapping_sort_cmp_default(const struct fy_node_pair *fynp_a,
                                            const struct fy_node_pair *fynp_b,
                                            void *arg) {
    int idx_a, idx_b;
    bool alias_a, alias_b, scalar_a, scalar_b;
    struct fy_node_cmp_arg *cmp_arg;
    fy_node_scalar_compare_fn cmp_fn;
    void *cmp_fn_arg;

    cmp_arg = arg;
    cmp_fn = cmp_arg ? cmp_arg->cmp_fn : fy_node_scalar_cmp_default;
    cmp_fn_arg = cmp_arg ? cmp_arg->arg : NULL;

    /* order is: maps first, followed by sequences, and last scalars sorted */
    scalar_a = !fynp_a->key || fy_node_is_scalar(fynp_a->key);
    scalar_b = !fynp_b->key || fy_node_is_scalar(fynp_b->key);

    /* scalar? perform comparison */
    if (scalar_a && scalar_b) {

        /* if both are aliases, sort skipping the '*' */
        alias_a = fy_node_is_alias(fynp_a->key);
        alias_b = fy_node_is_alias(fynp_b->key);

        /* aliases win */
        if (alias_a && !alias_b)
            return -1;

        if (!alias_a && alias_b)
            return 1;

        return cmp_fn(fynp_a->key, fynp_b->key, cmp_fn_arg);
    }

    /* b is scalar, a is not */
    if (!scalar_a && scalar_b)
        return -1;

    /* a is scalar, b is not */
    if (scalar_a && !scalar_b)
        return 1;

    /* different types, mappings win */
    if (fynp_a->key->type != fynp_b->key->type)
        return fynp_a->key->type == FYNT_MAPPING ? -1 : 1;

    /* ok, need to compare indices now */
    idx_a = fy_node_mapping_get_pair_index(fynp_a->parent, fynp_a);
    idx_b = fy_node_mapping_get_pair_index(fynp_b->parent, fynp_b);

    return idx_a > idx_b ? 1 : (idx_a < idx_b ? -1 : 0);
}